

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O2

void __thiscall
ScriptHash_ScriptHash_script_legacy_Test::TestBody(ScriptHash_ScriptHash_script_legacy_Test *this)

{
  char *message;
  AssertHelper AStack_98;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80 [4];
  ScriptHash script_hash;
  Script script;
  
  std::__cxx11::string::string
            ((string *)&script_hash,"76a91498e977b2259a85278aa51188bd863a3df0ad31ba88ac",
             (allocator *)local_80);
  cfd::core::Script::Script(&script,(string *)&script_hash);
  std::__cxx11::string::~string((string *)&script_hash);
  cfd::core::ScriptHash::ScriptHash(&script_hash,&script,false);
  cfd::core::ScriptHash::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"script_hash.GetHex().c_str()",
             "\"a9140e83a9df2e7937d27e90a26a06857407e39eb47487\"",(char *)local_80[0].ptr_,
             "a9140e83a9df2e7937d27e90a26a06857407e39eb47487");
  std::__cxx11::string::~string((string *)local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scripthash.cpp"
               ,0x36,message);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptHash::~ScriptHash(&script_hash);
  cfd::core::Script::~Script(&script);
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_script_legacy) {
  Script script("76a91498e977b2259a85278aa51188bd863a3df0ad31ba88ac");
  ScriptHash script_hash(script, false);
  // OP_HASH160 Hash160(script) OP_EQUAL
  EXPECT_STREQ(script_hash.GetHex().c_str(),
               "a9140e83a9df2e7937d27e90a26a06857407e39eb47487");
}